

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void __thiscall QUnifiedTimer::~QUnifiedTimer(QUnifiedTimer *this)

{
  int *piVar1;
  
  *(undefined ***)this = &PTR_metaObject_0069cf38;
  piVar1 = *(int **)(this + 0xa0);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0xa0),8,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x88);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x88),8,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x70);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x70),8,0x10);
    }
  }
  QBasicTimer::~QBasicTimer((QBasicTimer *)(this + 0x38));
  QDefaultAnimationDriver::~QDefaultAnimationDriver((QDefaultAnimationDriver *)(this + 0x18));
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QUnifiedTimer::~QUnifiedTimer()
    = default;